

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O3

void __thiscall
cfd::api::json::DecodeUnlockingScript::~DecodeUnlockingScript(DecodeUnlockingScript *this)

{
  ~DecodeUnlockingScript(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~DecodeUnlockingScript() {
    // do nothing
  }